

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher_link.cpp
# Opt level: O2

bool __thiscall miniros::PublisherLink::setHeader(PublisherLink *this,Header *header)

{
  bool bVar1;
  uint32_t uVar2;
  ConnectionManagerPtr *pCVar3;
  SubscriptionPtr parent;
  string md5sum;
  string latched_str;
  string type;
  string local_b0;
  PublisherLinkPtr local_90;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"callerid",(allocator<char> *)&local_40);
  Header::getValue(header,&local_80,&this->caller_id_);
  std::__cxx11::string::~string((string *)&local_80);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"md5sum",(allocator<char> *)&local_90);
  bVar1 = Header::getValue(header,&local_b0,&local_80);
  std::__cxx11::string::~string((string *)&local_b0);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&this->md5sum_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"type",(allocator<char> *)&local_90);
    bVar1 = Header::getValue(header,&local_b0,&local_40);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar1) {
      this->latched_ = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"latching",(allocator<char> *)&local_90);
      bVar1 = Header::getValue(header,&local_b0,&local_60);
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar1) {
        bVar1 = std::operator==(&local_60,"1");
        if (bVar1) {
          this->latched_ = true;
        }
      }
      pCVar3 = ConnectionManager::instance();
      uVar2 = ConnectionManager::getNewConnectionID
                        ((pCVar3->
                         super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr);
      this->connection_id_ = uVar2;
      std::
      __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)&this->header_,
                  (__shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)header);
      std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)&local_b0,
                 &this->parent_);
      if ((Subscription *)local_b0._M_dataplus._M_p != (Subscription *)0x0) {
        std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<miniros::PublisherLink,void>
                  ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&local_90,
                   (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<miniros::PublisherLink>);
        Subscription::headerReceived((Subscription *)local_b0._M_dataplus._M_p,&local_90,header);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_90.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
      bVar1 = true;
      goto LAB_0023edbb;
    }
  }
  bVar1 = false;
LAB_0023edbb:
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  return bVar1;
}

Assistant:

bool PublisherLink::setHeader(const Header& header)
{
  header.getValue("callerid", caller_id_);

  std::string md5sum, type, latched_str;
  if (!header.getValue("md5sum", md5sum))
  {
    MINIROS_ASSERT("Publisher header did not have required element: md5sum");
    return false;
  }

  md5sum_ = md5sum;

  if (!header.getValue("type", type))
  {
    MINIROS_ASSERT("Publisher header did not have required element: type");
    return false;
  }

  latched_ = false;
  if (header.getValue("latching", latched_str))
  {
    if (latched_str == "1")
    {
      latched_ = true;
    }
  }

  connection_id_ = ConnectionManager::instance()->getNewConnectionID();
  header_ = header;

  if (SubscriptionPtr parent = parent_.lock())
  {
    parent->headerReceived(shared_from_this(), header);
  }

  return true;
}